

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,uint32_t field_number,_func_bool_int *is_valid,
               UnknownFieldSet *unknown_fields,RepeatedField<int> *values)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  bool bVar4;
  Limit limit;
  int iVar5;
  uint32_t first_byte_or_zero;
  int64_t iVar6;
  ulong uVar7;
  uint first_byte_or_zero_00;
  int value;
  ulong unaff_R13;
  bool bVar8;
  
  pbVar2 = input->buffer_;
  if (pbVar2 < input->buffer_end_) {
    first_byte_or_zero_00 = (uint)*pbVar2;
    if (-1 < (char)*pbVar2) {
      input->buffer_ = pbVar2 + 1;
      bVar8 = true;
      goto LAB_0033021e;
    }
  }
  else {
    first_byte_or_zero_00 = 0;
  }
  iVar6 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero_00);
  first_byte_or_zero_00 = (uint)iVar6;
  bVar8 = -1 < iVar6;
LAB_0033021e:
  if (bVar8) {
    limit = io::CodedInputStream::PushLimit(input,first_byte_or_zero_00);
    do {
      iVar5 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar5 < 1) {
        io::CodedInputStream::PopLimit(input,limit);
        return true;
      }
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar7 = (ulong)bVar1;
        first_byte_or_zero = (uint32_t)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00330257;
        input->buffer_ = pbVar2 + 1;
        bVar8 = true;
      }
      else {
        first_byte_or_zero = 0;
LAB_00330257:
        uVar7 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
        bVar8 = -1 < (long)uVar7;
      }
      uVar3 = unaff_R13;
      if (bVar8) {
        uVar3 = uVar7;
      }
      unaff_R13 = uVar3 & 0xffffffff;
      if (!bVar8) {
        return false;
      }
      iVar5 = (int)uVar3;
      if ((is_valid == (_func_bool_int *)0x0) || (bVar4 = (*is_valid)(iVar5), bVar4)) {
        RepeatedField<int>::Add(values,iVar5);
      }
      else {
        UnknownFieldSet::AddVarint(unknown_fields,field_number,(long)iVar5);
      }
    } while (bVar8);
  }
  return false;
}

Assistant:

bool WireFormat::ReadPackedEnumPreserveUnknowns(io::CodedInputStream* input,
                                                uint32_t field_number,
                                                bool (*is_valid)(int),
                                                UnknownFieldSet* unknown_fields,
                                                RepeatedField<int>* values) {
  uint32_t length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
            input, &value)) {
      return false;
    }
    if (is_valid == nullptr || is_valid(value)) {
      values->Add(value);
    } else {
      unknown_fields->AddVarint(field_number, value);
    }
  }
  input->PopLimit(limit);
  return true;
}